

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_pushcclosure(lua_State *L,lua_CFunction fn,int n)

{
  StkId pSVar1;
  CClosure *x_;
  CClosure *pCVar2;
  ulong uVar3;
  long lVar4;
  StkId pSVar5;
  
  if (n == 0) {
    pSVar1 = (L->top).p;
    (pSVar1->val).value_.f = fn;
    (pSVar1->val).tt_ = '\x16';
    (L->top).p = (StkId)((L->top).offset + 0x10);
  }
  else {
    pCVar2 = luaF_newCclosure(L,n);
    pCVar2->f = fn;
    if (0 < n) {
      uVar3 = (ulong)(uint)n;
      lVar4 = 0;
      do {
        pSVar1 = (L->top).p;
        *(undefined8 *)((long)&pCVar2->upvalue[0].value_ + lVar4) =
             *(undefined8 *)((long)pSVar1 + lVar4 + uVar3 * -0x10);
        (&pCVar2->upvalue[0].tt_)[lVar4] = *(lu_byte *)((long)pSVar1 + lVar4 + 8 + uVar3 * -0x10);
        lVar4 = lVar4 + 0x10;
      } while (uVar3 * 0x10 != lVar4);
    }
    pSVar1 = (L->top).p;
    pSVar5 = pSVar1 + -(long)n;
    (L->top).p = pSVar5;
    *(CClosure **)pSVar5 = pCVar2;
    *(undefined1 *)((long)pSVar1 + (long)n * -0x10 + 8) = 0x66;
    (L->top).p = (StkId)((L->top).offset + 0x10);
    if (L->l_G->GCdebt < 1) {
      luaC_step(L);
      return;
    }
  }
  return;
}

Assistant:

LUA_API void lua_pushcclosure (lua_State *L, lua_CFunction fn, int n) {
  lua_lock(L);
  if (n == 0) {
    setfvalue(s2v(L->top.p), fn);
    api_incr_top(L);
  }
  else {
    int i;
    CClosure *cl;
    api_checkpop(L, n);
    api_check(L, n <= MAXUPVAL, "upvalue index too large");
    cl = luaF_newCclosure(L, n);
    cl->f = fn;
    for (i = 0; i < n; i++) {
      setobj2n(L, &cl->upvalue[i], s2v(L->top.p - n + i));
      /* does not need barrier because closure is white */
      lua_assert(iswhite(cl));
    }
    L->top.p -= n;
    setclCvalue(L, s2v(L->top.p), cl);
    api_incr_top(L);
    luaC_checkGC(L);
  }
  lua_unlock(L);
}